

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QWidget * QApplication::activePopupWidget(void)

{
  QWidgetWindow *pQVar1;
  QWidgetWindow *win;
  undefined8 local_10;
  
  QGuiApplicationPrivate::activePopupWindow();
  pQVar1 = qobject_cast<QWidgetWindow*>((QObject *)0x2ca475);
  if (pQVar1 == (QWidgetWindow *)0x0) {
    local_10 = (QWidget *)0x0;
  }
  else {
    local_10 = QWidgetWindow::widget((QWidgetWindow *)0x2ca48c);
  }
  return local_10;
}

Assistant:

QWidget *QApplication::activePopupWidget()
{
    auto *win = qobject_cast<QWidgetWindow *>(QGuiApplicationPrivate::activePopupWindow());
    return win ? win->widget() : nullptr;
}